

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

void Fossilize::Hashing::hash_pnext_struct
               (StateRecorder *param_1,Hasher *h,VkPipelineColorWriteCreateInfoEXT *info,
               DynamicStateInfo *dynamic_state_info)

{
  uint local_2c;
  uint32_t i;
  DynamicStateInfo *dynamic_state_info_local;
  VkPipelineColorWriteCreateInfoEXT *info_local;
  Hasher *h_local;
  StateRecorder *param_0_local;
  
  Hasher::u32(h,info->attachmentCount);
  if ((dynamic_state_info != (DynamicStateInfo *)0x0) &&
     ((dynamic_state_info->color_write_enable & 1U) == 0)) {
    for (local_2c = 0; local_2c < info->attachmentCount; local_2c = local_2c + 1) {
      Hasher::u32(h,info->pColorWriteEnables[local_2c]);
    }
  }
  return;
}

Assistant:

static void hash_pnext_struct(const StateRecorder *,
                              Hasher &h,
                              const VkPipelineColorWriteCreateInfoEXT &info,
                              const DynamicStateInfo *dynamic_state_info)
{
	h.u32(info.attachmentCount);
	if (dynamic_state_info && !dynamic_state_info->color_write_enable)
		for (uint32_t i = 0; i < info.attachmentCount; i++)
			h.u32(info.pColorWriteEnables[i]);
}